

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

void __thiscall Board::print(Board *this)

{
  TileValue TVar1;
  uint uVar2;
  ostream *poVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (this->SIZE != 0) {
    uVar7 = 0;
    do {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      uVar2 = this->SIZE;
      if (uVar2 != 0) {
        uVar6 = 0;
        do {
          TVar1 = (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar2 * uVar7 + uVar6].value;
          cVar4 = (char)TVar1 + '0';
          if (TVar1 == Empty) {
            cVar4 = '-';
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
          local_50 = (long *)CONCAT71(local_50._1_7_,cVar4);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)&local_50,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          uVar5 = uVar6 + 1;
          uVar2 = this->SIZE;
          if (uVar6 != uVar2 - 1 && uVar5 % this->SQUARE_SIZE == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
            uVar2 = this->SIZE;
          }
          uVar6 = uVar5;
        } while (uVar5 < uVar2);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      uVar6 = uVar7 + 1;
      uVar2 = this->SIZE;
      if (uVar7 != uVar2 - 1 && uVar6 % this->SQUARE_SIZE == 0) {
        local_50 = local_40;
        std::__cxx11::string::_M_construct((ulong)&local_50,'&');
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_50,local_48);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        uVar2 = this->SIZE;
      }
      uVar7 = uVar6;
    } while (uVar6 < uVar2);
  }
  return;
}

Assistant:

void Board::print() const
{
	for (row r = 0; r < Board::SIZE; r++)
	{
		std::cout << std::endl;

		for (column c = 0; c < Board::SIZE; c++)
		{
			auto tile = _tiles[translate(c, r, Board::SIZE)];
			auto value = tile.value == TileValue::Empty ? '-' : static_cast<char>((int)tile.value + 48);

			std::cout << "  " << value << " ";

			if ((c + 1) % Board::SQUARE_SIZE == 0 && c != Board::SIZE - 1)
				std::cout << "|";
		}

		std::cout << std::endl;

		if ((r + 1) % Board::SQUARE_SIZE == 0 && r != Board::SIZE - 1)
		{
			std::cout << std::string(38, '_') << std::endl;
		}
	}

}